

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::string_maker<double>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,string_maker<double> *this,double *value)

{
  uint *puVar1;
  ostringstream os;
  char *local_1b0;
  size_type local_1a8;
  char local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::_M_insert<double>(*(double *)this);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  local_1a8 = 0;
  local_1a0 = '\0';
  local_1b0 = &local_1a0;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }